

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_utility.cc
# Opt level: O2

string * __thiscall
google::protobuf::util::converter::(anonymous_namespace)::AppendPathSegmentToPrefix_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,StringPiece prefix,
          StringPiece segment)

{
  StringPiece prefix_00;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  StringPiece *this_00;
  AlphaNum *pAVar4;
  AlphaNum *c;
  StringPiece str;
  AlphaNum local_f0;
  _anonymous_namespace_ *local_c0;
  char *local_b8;
  AlphaNum local_90;
  StringPiece local_60;
  undefined1 local_50 [8];
  StringPiece prefix_local;
  StringPiece segment_local;
  
  pAVar4 = (AlphaNum *)segment.ptr_;
  pcVar2 = (char *)prefix.length_;
  pcVar3 = prefix.ptr_;
  local_50 = (undefined1  [8])this;
  prefix_local.ptr_ = pcVar3;
  prefix_local.length_ = (stringpiece_ssize_type)pcVar2;
  if (pcVar3 == (char *)0x0) {
    this_00 = (StringPiece *)&prefix_local.length_;
  }
  else {
    if (pAVar4 != (AlphaNum *)0x0) {
      c = pAVar4;
      StringPiece::StringPiece(&local_60,"[\"");
      prefix_00.length_ = local_60.length_;
      prefix_00.ptr_ = local_60.ptr_;
      str.length_ = (stringpiece_ssize_type)pAVar4;
      str.ptr_ = pcVar2;
      bVar1 = HasPrefixString(str,prefix_00);
      local_c0 = this;
      local_b8 = pcVar3;
      if (bVar1) {
        local_90.piece_data_ = pcVar2;
        local_90.piece_size_ = (size_t)pAVar4;
        StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_c0,&local_90,
                          (AlphaNum *)local_60.length_);
        return __return_storage_ptr__;
      }
      local_90.piece_data_ = ".";
      local_90.piece_size_ = 1;
      local_f0.piece_data_ = pcVar2;
      local_f0.piece_size_ = (size_t)pAVar4;
      StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_c0,&local_90,&local_f0,c);
      return __return_storage_ptr__;
    }
    this_00 = (StringPiece *)local_50;
  }
  StringPiece::ToString_abi_cxx11_(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string AppendPathSegmentToPrefix(StringPiece prefix,
                                      StringPiece segment) {
  if (prefix.empty()) {
    return std::string(segment);
  }
  if (segment.empty()) {
    return std::string(prefix);
  }
  // If the segment is a map key, appends it to the prefix without the ".".
  if (HasPrefixString(segment, "[\"")) {
    return StrCat(prefix, segment);
  }
  return StrCat(prefix, ".", segment);
}